

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoDGofR.cpp
# Opt level: O2

void __thiscall
OpenMD::TwoDGofR::TwoDGofR
          (TwoDGofR *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          RealType dz,int nrbins)

{
  ulong __new_size;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  RadialDistrFunc::RadialDistrFunc(&this->super_RadialDistrFunc,info,filename,sele1,sele2,nrbins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__TwoDGofR_002eeb38;
  this->len_ = len;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->avgTwoDGofR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgTwoDGofR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgTwoDGofR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  this->deltaR_ = len / (double)__new_size;
  this->deltaZ_ = dz;
  std::vector<int,_std::allocator<int>_>::resize(&this->histogram_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->avgTwoDGofR_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  getPrefix(&local_60,filename);
  std::operator+(&local_40,&local_60,".TwoDGofR");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

TwoDGofR::TwoDGofR(SimInfo* info, const std::string& filename,
                     const std::string& sele1, const std::string& sele2,
                     RealType len, RealType dz, int nrbins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      len_(len) {
    deltaR_ = len_ / nBins_;

    deltaZ_ = dz;

    histogram_.resize(nBins_);
    avgTwoDGofR_.resize(nBins_);

    setOutputName(getPrefix(filename) + ".TwoDGofR");
  }